

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O0

QVariant * __thiscall QGnomeTheme::themeHint(QGnomeTheme *this,ThemeHint hint)

{
  initializer_list<Qt::Key> args;
  QArrayDataPointer<char16_t> *this_00;
  QSize QVar1;
  undefined4 in_EDX;
  QPlatformTheme *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  char16_t *str_3;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  QStringList styleNames;
  DataPointer *in_stack_fffffffffffffde8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffdf0;
  undefined4 uVar2;
  ThemeHint hint_00;
  undefined1 local_158 [54];
  QChar local_122;
  QArrayDataPointer<char16_t> local_120 [2];
  QArrayDataPointer<char16_t> local_f0 [2];
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 local_90 [24];
  QArrayDataPointer<char16_t> local_78;
  undefined1 local_60 [24];
  QArrayDataPointer<char16_t> local_48;
  undefined1 local_30 [24];
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  uVar2 = SUB84(in_RDI,0);
  hint_00 = (ThemeHint)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_EDX) {
  case 0xe:
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_48,(Data *)0x0,L"Adwaita",7);
    QString::QString((QString *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    ::QVariant::QVariant(in_RDI,(QString *)local_30);
    QString::~QString((QString *)0xae68f1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffdf0);
    break;
  case 0xf:
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_78,(Data *)0x0,L"gnome",5);
    QString::QString((QString *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    ::QVariant::QVariant(in_RDI,(QString *)local_60);
    QString::~QString((QString *)0xae6984);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffdf0);
    break;
  case 0x10:
    QGenericUnixTheme::xdgIconThemePaths();
    ::QVariant::QVariant(in_RDI,(QList_conflict3 *)local_90);
    QList<QString>::~QList((QList<QString> *)0xae69c2);
    break;
  case 0x11:
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)0xae6a32);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_f0,(Data *)0x0,L"Fusion",6);
    QString::QString((QString *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    this_00 = (QArrayDataPointer<char16_t> *)
              QList<QString>::operator<<
                        ((QList<QString> *)in_stack_fffffffffffffdf0,
                         (rvalue_ref)in_stack_fffffffffffffde8);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_120,(Data *)0x0,L"windows",7);
    QString::QString((QString *)this_00,in_stack_fffffffffffffde8);
    QList<QString>::operator<<((QList<QString> *)this_00,(rvalue_ref)in_stack_fffffffffffffde8);
    QString::~QString((QString *)0xae6b20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    QString::~QString((QString *)0xae6b3a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    ::QVariant::QVariant(in_RDI,(QList_conflict3 *)&local_c0);
    QList<QString>::~QList((QList<QString> *)0xae6b66);
    break;
  default:
    QPlatformTheme::themeHint(in_RSI,hint_00);
    break;
  case 0x13:
    ::QVariant::QVariant(in_RDI,3);
    break;
  case 0x14:
    ::QVariant::QVariant(in_RDI,true);
    break;
  case 0x16:
    ::QVariant::QVariant(in_RDI,4);
    break;
  case 0x17:
    ::QVariant::QVariant(in_RDI,0x80);
    break;
  case 0x1a:
    QGenericUnixTheme::availableXdgFileIconSizes();
    ::QVariant::fromValue<QList<QSize>,_true>((QList<QSize> *)in_RDI);
    QList<QSize>::~QList((QList<QSize> *)0xae69f3);
    break;
  case 0x1b:
    QChar::QChar<int,_true>(&local_122,0x2022);
    ::QVariant::QVariant(in_RDI,local_122);
    break;
  case 0x27:
    ::QVariant::QVariant(in_RDI,true);
    break;
  case 0x28:
    local_18 = 0x20;
    local_14 = 0x1000004;
    local_10 = 0x1000005;
    local_c = 0x1010000;
    args._M_len = (size_type)in_RSI;
    args._M_array = (iterator)in_RDI;
    QList<Qt::Key>::QList((QList<Qt::Key> *)in_RDI,args);
    ::QVariant::fromValue<QList<Qt::Key>,_true>((QList<Qt::Key> *)in_RDI);
    QList<Qt::Key>::~QList((QList<Qt::Key> *)0xae6c34);
    break;
  case 0x2e:
    QGenericUnixTheme::mouseCursorTheme();
    ::QVariant::QVariant(in_RDI,(QString *)local_158);
    QString::~QString((QString *)0xae6c76);
    break;
  case 0x2f:
    QVar1 = QGenericUnixTheme::mouseCursorSize();
    ::QVariant::QVariant(in_RDI,(QSize *)QVar1);
    break;
  case 0x32:
    ::QVariant::QVariant(in_RDI,true);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QVariant *)CONCAT44(hint_00,uVar2);
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGnomeTheme::themeHint(QPlatformTheme::ThemeHint hint) const
{
    switch (hint) {
    case QPlatformTheme::DialogButtonBoxButtonsHaveIcons:
        return QVariant(true);
    case QPlatformTheme::DialogButtonBoxLayout:
        return QVariant(QPlatformDialogHelper::GnomeLayout);
    case QPlatformTheme::SystemIconThemeName:
        return QVariant(QStringLiteral("Adwaita"));
    case QPlatformTheme::SystemIconFallbackThemeName:
        return QVariant(QStringLiteral("gnome"));
    case QPlatformTheme::IconThemeSearchPaths:
        return QVariant(xdgIconThemePaths());
    case QPlatformTheme::IconPixmapSizes:
        return QVariant::fromValue(availableXdgFileIconSizes());
    case QPlatformTheme::StyleNames: {
        QStringList styleNames;
        styleNames << QStringLiteral("Fusion") << QStringLiteral("windows");
        return QVariant(styleNames);
    }
    case QPlatformTheme::KeyboardScheme:
        return QVariant(int(GnomeKeyboardScheme));
    case QPlatformTheme::PasswordMaskCharacter:
        return QVariant(QChar(0x2022));
    case QPlatformTheme::UiEffects:
        return QVariant(int(HoverEffect));
    case QPlatformTheme::ButtonPressKeys:
        return QVariant::fromValue(
                QList<Qt::Key>({ Qt::Key_Space, Qt::Key_Return, Qt::Key_Enter, Qt::Key_Select }));
    case QPlatformTheme::PreselectFirstFileInDirectory:
        return true;
    case QPlatformTheme::MouseCursorTheme:
        return QVariant(mouseCursorTheme());
    case QPlatformTheme::MouseCursorSize:
        return QVariant(mouseCursorSize());
    case QPlatformTheme::PreferFileIconFromTheme:
        return true;
    default:
        break;
    }
    return QPlatformTheme::themeHint(hint);
}